

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

target_ulong helper_addsc_mips64(target_ulong rs,target_ulong rt,CPUMIPSState_conflict5 *env)

{
  long lVar1;
  
  lVar1 = (rt & 0xffffffff) + (rs & 0xffffffff);
  (env->active_tc).DSPControl =
       (ulong)(uint)((int)((ulong)lVar1 >> 0x20) << 0xd) |
       (env->active_tc).DSPControl & 0xffffffffffffdfff;
  return (long)(int)lVar1;
}

Assistant:

target_ulong helper_addsc(target_ulong rs, target_ulong rt, CPUMIPSState *env)
{
    uint64_t temp, tempRs, tempRt;
    bool flag;

    tempRs = (uint64_t)rs & MIPSDSP_LLO;
    tempRt = (uint64_t)rt & MIPSDSP_LLO;

    temp = tempRs + tempRt;
    flag = (temp & 0x0100000000ull) >> 32;
    set_DSPControl_carryflag(flag, env);

    return (target_long)(int32_t)(temp & MIPSDSP_LLO);
}